

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O1

void zt_log_lstrerror(zt_log_ty *log,zt_log_level level,int errnum,char *fmt,...)

{
  char in_AL;
  zt_log_ctx_ty *pzVar1;
  size_t __n;
  char *fmt_00;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_108;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (((log != (zt_log_ty *)0x0) || (log = zt_log_get_logger(), log != (zt_log_ty *)0x0)) &&
     (level <= log->level)) {
    __n = strlen(fmt);
    fmt_00 = (char *)malloc(__n + 0x100);
    memcpy(fmt_00,fmt,__n);
    pcVar2 = fmt_00 + __n;
    pcVar2[0] = ':';
    pcVar2[1] = ' ';
    pcVar2 = strerror_r(errnum,pcVar2 + 2,0xfd);
    if (pcVar2 != (char *)0x0) {
      zt_log_lprintf(log,zt_log_crit,"Could not capture error string");
    }
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &ap[0].overflow_arg_area;
    local_108.gp_offset = 0x20;
    local_108.fp_offset = 0x30;
    zt_log_lvprintf(log,level,fmt_00,&local_108);
    free(fmt_00);
    return;
  }
  pzVar1 = zt_log_get_ctx();
  pzVar1->file = (char *)0x0;
  pzVar1->line = -1;
  pzVar1->function = (char *)0x0;
  return;
}

Assistant:

void
zt_log_lstrerror(zt_log_ty * log, zt_log_level level, int errnum, const char * fmt, ...) {
    va_list ap;
    size_t llen;
    char    * nfmt;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }

    if (level > log->level) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }

    llen           = strlen(fmt);


    nfmt           = (char*)malloc(llen + 256);
    memcpy(nfmt, fmt, llen);
    nfmt[llen]     = ':';
    nfmt[llen + 1] = ' ';

    if (strerror_r(errnum, nfmt + (llen + 2), 255 - 2) != 0) {
      zt_log_lprintf(log, zt_log_crit, "Could not capture error string");
    }

    va_start(ap, fmt);
    zt_log_lvprintf(log, level, nfmt, ap);
    va_end(ap);

    free(nfmt);
}